

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

void setMethyleneProp(atom *a)

{
  byte *pbVar1;
  char *pcVar2;
  ResidueAndAtomPair *pRVar3;
  char *__needle;
  
  __needle = a->r->resname;
  pcVar2 = strstr(":LYS:ILE:ARG:PRO:GLN:GLU:MET:CIS:SER:ASN:ASP:PHE:TYR:TRP:LEU:",__needle);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = ":LYS:";
    pRVar3 = MethyleneAtomsTbl;
    do {
      pRVar3 = pRVar3 + 1;
      pcVar2 = strstr(pcVar2,__needle);
      if ((pcVar2 != (char *)0x0) &&
         (pcVar2 = strstr(pRVar3[-1].alist,a->atomname), pcVar2 != (char *)0x0)) {
        pbVar1 = (byte *)((long)&a->props + 3);
        *pbVar1 = *pbVar1 | 0x40;
        return;
      }
      pcVar2 = pRVar3->rlist;
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void setMethyleneProp(atom *a) {
   ResidueAndAtomPair *pair;

   if(strstr(MethyleneResList, a->r->resname)) {
      for(pair = MethyleneAtomsTbl; pair->rlist && pair->alist; pair++) {
         if(   (strstr(pair->rlist, a->r->resname))
            && (strstr(pair->alist, a->atomname))   ) {
            a->props |= METHYLENE_PROP;
            break;
         }
      }
   }
}